

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O3

bool __thiscall
dg::vr::VectorSet<llvm::Value_const*>::erase<llvm::Value_const*,bool>
          (VectorSet<llvm::Value_const*> *this,Value **val)

{
  Value **__src;
  Value **ppVVar1;
  __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  __dest;
  Value **ppVVar2;
  
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<llvm::Value_const**,std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<llvm::Value_const*const>>
                     (*(undefined8 *)this,*(undefined8 *)(this + 8),val);
  ppVVar1 = *(Value ***)(this + 8);
  if (__dest._M_current != ppVVar1) {
    __src = __dest._M_current + 1;
    ppVVar2 = ppVVar1;
    if (__src != ppVVar1) {
      memmove(__dest._M_current,__src,(long)ppVVar1 - (long)__src);
      ppVVar2 = *(Value ***)(this + 8);
    }
    *(Value ***)(this + 8) = ppVVar2 + -1;
  }
  return __dest._M_current != ppVVar1;
}

Assistant:

bool erase(const S &val) {
        auto it = find(val);
        if (it == vec.end())
            return false;
        vec.erase(it);
        return true;
    }